

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O0

Pixmap __thiscall
Am_Image_Array_Data::Safe_Get_X_Pixmap(Am_Image_Array_Data *this,Am_Drawonable_Impl *draw)

{
  undefined8 uVar1;
  Pixmap PVar2;
  bool bVar3;
  Am_Generic_Image *this_00;
  uchar *puVar4;
  ostream *poVar5;
  unsigned_short local_58;
  unsigned_short local_56 [3];
  unsigned_short height;
  unsigned_short width;
  int local_48;
  int local_44;
  int tmp;
  uint h;
  uint w;
  int n_cols;
  XColor *cols;
  Pixmap bitmap;
  Display *disp;
  Am_Drawonable_Impl *draw_local;
  Am_Image_Array_Data *this_local;
  
  bitmap = (Pixmap)draw->screen->display;
  if ((Display *)bitmap == this->main_display) {
    this_local = (Am_Image_Array_Data *)this->main_bitmap;
  }
  else {
    disp = (Display *)draw;
    draw_local = (Am_Drawonable_Impl *)this;
    bVar3 = Get_Bitmap(this,(Display *)bitmap,(Pixmap *)&cols);
    if (bVar3) {
      this_local = (Am_Image_Array_Data *)cols;
    }
    else {
      _w = (XColor *)0x0;
      h = 0;
      if (this->name == (char *)0x0) {
        Am_Generic_Image::Get_Size(this->image_,local_56,&local_58);
        PVar2 = bitmap;
        uVar1 = *(undefined8 *)(disp + 0x80);
        puVar4 = Am_Generic_Image::Get_Data(this->image_);
        cols = (XColor *)XCreateBitmapFromData(PVar2,uVar1,puVar4,local_56[0],local_58);
        if (cols == (XColor *)0xb) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Bad Alloc error");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          Am_Error();
        }
        if (cols == (XColor *)0x9) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"Bad Drawable error");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          Am_Error();
        }
      }
      else {
        bVar3 = is_gif(this);
        if (bVar3) {
          bVar3 = make_generic_image_from_name(this);
          if (!bVar3) {
            return 0;
          }
          cols = (XColor *)
                 Make_Pixmap_From_Generic_Image
                           (this,(Am_Drawonable_Impl *)disp,(XColor **)&w,(int *)&h);
        }
        else {
          local_48 = XReadBitmapFile(bitmap,*(undefined8 *)(disp + 0x80),this->name,&tmp,&local_44,
                                     &cols,&this->x_hot,&this->y_hot);
          this_00 = (Am_Generic_Image *)operator_new(0x20);
          Am_Generic_Image::Am_Generic_Image(this_00,(uchar *)0x0,tmp,local_44,1);
          this->image_ = this_00;
          if (local_48 != 0) {
            return 0;
          }
        }
      }
      if (this->main_display == (Display *)0x0) {
        this->main_display = (Display *)bitmap;
        this->main_bitmap = (Pixmap)cols;
        this->colors = _w;
        this->num_colors = h;
      }
      else {
        Add_Bitmap(this,(Display *)bitmap,(Pixmap)cols,_w,h);
      }
      this_local = (Am_Image_Array_Data *)cols;
    }
  }
  return (Pixmap)this_local;
}

Assistant:

Pixmap
Am_Image_Array_Data::Safe_Get_X_Pixmap(const Am_Drawonable_Impl *draw)
{
  Display *disp = draw->screen->display;
  if (disp == main_display)
    return main_bitmap;

  Pixmap bitmap;

  if (Get_Bitmap(disp, bitmap))
    return bitmap;

  XColor *cols = nullptr;
  int n_cols = 0;

  /* then we need to read it in or make it */
  if (name) {
    unsigned int w, h;

    /* read image rom a file */

    if (is_gif()) {
      if (!make_generic_image_from_name())
        return 0;
      bitmap = Make_Pixmap_From_Generic_Image(draw, cols, n_cols);
    } else { // it's an xbm
      int tmp = XReadBitmapFile(disp, draw->xlib_drawable, name, &w, &h,
                                &bitmap, &x_hot, &y_hot);
      // fill an empty structure to store width, height in.
      image_ = new Am_Generic_Image(nullptr, w, h, 1);
      if (tmp != BitmapSuccess)
        return 0;
    } // else bmp format
  } else {
    // then we need to make it from data
    // Assume that it's in XYBitmap format in the generic image item.
    unsigned short int width, height;
    image_->Get_Size(width, height);
    bitmap = XCreateBitmapFromData(disp, draw->xlib_drawable,
                                   (char *)image_->Get_Data(), width, height);

    if (bitmap == BadAlloc) {
      std::cerr << "Bad Alloc error" << std::endl;
      Am_Error();
    }
    if (bitmap == BadDrawable) {
      std::cerr << "Bad Drawable error" << std::endl;
      Am_Error();
    }
  }

  if (main_display)
    Add_Bitmap(disp, bitmap, cols, n_cols);
  else {
    main_display = disp;
    main_bitmap = bitmap;
    colors = cols;
    num_colors = n_cols;
  }
  return bitmap;
}